

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

int P_Set3DFloor(line_t *line,int param,int param2,int alpha)

{
  sector_t *sec2;
  line_t *plVar1;
  side_t *this;
  bool bVar2;
  int iVar3;
  FDynamicColormap *pFVar4;
  FNullTextureID local_68;
  FTextureID local_64;
  FTextureID local_60;
  FTextureID local_5c;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_58;
  FTextureID tex;
  line_t *l;
  FSectorTagIterator itr;
  sector_t *ss;
  sector_t *sec;
  uint local_28;
  int tag;
  int flags;
  int i;
  int s;
  int alpha_local;
  int param2_local;
  int param_local;
  line_t *line_local;
  
  sec2 = line->frontsector;
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&l,line->args[0]);
  i = alpha;
  do {
    iVar3 = FSectorTagIterator::Next((FSectorTagIterator *)&l);
    if (iVar3 < 0) {
      local_60 = side_t::GetTexture(line->sidedef[0],0);
      bVar2 = FTextureID::isValid(&local_60);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this = line->sidedef[0];
        FNullTextureID::FNullTextureID(&local_68);
        local_64 = local_68.super_FTextureID.texnum;
        side_t::SetTexture(this,0,local_68.super_FTextureID);
      }
      return 1;
    }
    itr = (FSectorTagIterator)(sectors + iVar3);
    if (param == 0) {
      local_28 = 0x40000f;
      i = 0xff;
      for (tag = 0; tag < sec2->linecount; tag = tag + 1) {
        plVar1 = sec2->lines[tag];
        if ((plVar1->special == 0xa1) && (plVar1->frontsector == sec2)) {
          iVar3 = clamp<int>(plVar1->args[1],0,100);
          if ((plVar1->args[2] & 1U) != 0) {
            local_28 = 0x40000d;
          }
          if ((plVar1->args[2] & 2U) != 0) {
            local_28 = local_28 | 0x2000000;
          }
          if ((plVar1->args[2] & 4U) != 0) {
            local_28 = local_28 | 0x4000000;
          }
          if ((plVar1->args[2] & 8U) != 0) {
            local_28 = local_28 | 0x10000000;
          }
          if (iVar3 != 100) {
            local_28 = local_28 | 0x800;
          }
          if (plVar1->args[0] != 0) {
            local_28 = local_28 | 0x20004210;
            tex.texnum = *(int *)&(plVar1->frontsector->ColorMap->Color).field_0.field_0;
            PalEntry::PalEntry((PalEntry *)&local_58.field_0,
                               P_Set3DFloor::vavoomcolors[plVar1->args[0]]);
            pFVar4 = GetSpecialLights((PalEntry)tex.texnum,(PalEntry)local_58.field_0,
                                      plVar1->frontsector->ColorMap->Desaturate);
            plVar1->frontsector->ColorMap = pFVar4;
          }
          i = (iVar3 * 0xff) / 100;
          break;
        }
      }
    }
    else if (param == 4) {
      local_28 = 0x202029;
      if ((param2 & 1U) != 0) {
        local_28 = 0x2202029;
      }
      i = 0xff;
    }
    else {
      local_28 = P_Set3DFloor::defflags[(int)(param & 3)] | 0xd;
      if ((param & 4U) != 0) {
        local_28 = P_Set3DFloor::defflags[(int)(param & 3)] | 0x420d;
      }
      if ((param & 0x10U) != 0) {
        local_28 = local_28 ^ 0x2000000;
      }
      if ((param & 0x20U) != 0) {
        local_28 = local_28 ^ 0x4000000;
      }
      if ((param2 & 1U) != 0) {
        local_28 = local_28 | 0x20;
      }
      if ((param2 & 2U) != 0) {
        local_28 = local_28 | 0x10000;
      }
      if ((param2 & 4U) != 0) {
        local_28 = local_28 | 0x1000;
      }
      if ((param2 & 8U) != 0) {
        local_28 = local_28 | 0x80000;
      }
      if ((param2 & 0x10U) != 0) {
        local_28 = local_28 | 0x20000;
      }
      if ((param2 & 0x20U) != 0) {
        local_28 = local_28 | 0x40000;
      }
      if ((param2 & 0x40U) != 0) {
        local_28 = local_28 | 0x10000800;
      }
      if (((param2 & 0x80U) != 0) && ((local_28 & 2) == 0)) {
        local_28 = local_28 | 0x26000000;
      }
      if ((param2 & 0x200U) != 0) {
        local_28 = local_28 | 0x8000000;
      }
      if ((param2 & 0x400U) != 0) {
        local_28 = local_28 | 0x80000000;
      }
      local_5c = side_t::GetTexture(line->sidedef[0],0);
      bVar2 = FTextureID::Exists(&local_5c);
      if ((!bVar2) && (i < 0xff)) {
        iVar3 = FTextureID::GetIndex(&local_5c);
        i = -iVar3;
      }
      i = clamp<int>(i,0,0xff);
      if (i == 0) {
        local_28 = local_28 & 0xffffbdf3;
      }
      else if (i != 0xff) {
        local_28 = local_28 | 0x800;
      }
    }
    P_Add3DFloor((sector_t *)itr,sec2,line,local_28,i);
  } while( true );
}

Assistant:

static int P_Set3DFloor(line_t * line, int param, int param2, int alpha)
{
	int s, i;
	int flags;
	int tag = line->args[0];
	sector_t * sec = line->frontsector, *ss;

	FSectorTagIterator itr(tag);
	while ((s = itr.Next()) >= 0)
	{
		ss = &sectors[s];

		if (param == 0)
		{
			flags = FF_EXISTS | FF_RENDERALL | FF_SOLID | FF_INVERTSECTOR;
			alpha = 255;
			for (i = 0; i < sec->linecount; i++)
			{
				line_t * l = sec->lines[i];

				if (l->special == Sector_SetContents && l->frontsector == sec)
				{
					alpha = clamp<int>(l->args[1], 0, 100);
					if (l->args[2] & 1) flags &= ~FF_SOLID;
					if (l->args[2] & 2) flags |= FF_SEETHROUGH;
					if (l->args[2] & 4) flags |= FF_SHOOTTHROUGH;
					if (l->args[2] & 8) flags |= FF_ADDITIVETRANS;
					if (alpha != 100) flags |= FF_TRANSLUCENT;//|FF_BOTHPLANES|FF_ALLSIDES;
					if (l->args[0])
					{
						// Yes, Vavoom's 3D-floor definitions suck!
						// The content list changed in r1783 of Vavoom to be unified
						// among all its supported games, so it has now ten different
						// values instead of just five.
						static DWORD vavoomcolors[] = { VC_EMPTY,
							VC_WATER, VC_LAVA, VC_NUKAGE, VC_SLIME, VC_HELLSLIME,
							VC_BLOOD, VC_SLUDGE, VC_HAZARD, VC_BOOMWATER };
						flags |= FF_SWIMMABLE | FF_BOTHPLANES | FF_ALLSIDES | FF_FLOOD;

						l->frontsector->ColorMap =
							GetSpecialLights(l->frontsector->ColorMap->Color,
							vavoomcolors[l->args[0]],
							l->frontsector->ColorMap->Desaturate);
					}
					alpha = (alpha * 255) / 100;
					break;
				}
			}
		}
		else if (param == 4)
		{
			flags = FF_EXISTS | FF_RENDERPLANES | FF_INVERTPLANES | FF_NOSHADE | FF_FIX;
			if (param2 & 1) flags |= FF_SEETHROUGH;	// marker for allowing missing texture checks
			alpha = 255;
		}
		else
		{
			static const int defflags[] = { 0,
				FF_SOLID,
				FF_SWIMMABLE | FF_BOTHPLANES | FF_ALLSIDES | FF_SHOOTTHROUGH | FF_SEETHROUGH,
				FF_SHOOTTHROUGH | FF_SEETHROUGH,
			};

			flags = defflags[param & 3] | FF_EXISTS | FF_RENDERALL;

			if (param & 4) flags |= FF_ALLSIDES | FF_BOTHPLANES;
			if (param & 16) flags ^= FF_SEETHROUGH;
			if (param & 32) flags ^= FF_SHOOTTHROUGH;

			if (param2 & 1) flags |= FF_NOSHADE;
			if (param2 & 2) flags |= FF_DOUBLESHADOW;
			if (param2 & 4) flags |= FF_FOG;
			if (param2 & 8) flags |= FF_THINFLOOR;
			if (param2 & 16) flags |= FF_UPPERTEXTURE;
			if (param2 & 32) flags |= FF_LOWERTEXTURE;
			if (param2 & 64) flags |= FF_ADDITIVETRANS | FF_TRANSLUCENT;
			// if flooding is used the floor must be non-solid and is automatically made shootthrough and seethrough
			if ((param2 & 128) && !(flags & FF_SOLID)) flags |= FF_FLOOD | FF_SEETHROUGH | FF_SHOOTTHROUGH;
			if (param2 & 512) flags |= FF_FADEWALLS;
			if (param2&1024) flags |= FF_RESET;
			FTextureID tex = line->sidedef[0]->GetTexture(side_t::top);
			if (!tex.Exists() && alpha < 255)
			{
				alpha = -tex.GetIndex();
			}
			alpha = clamp(alpha, 0, 255);
			if (alpha == 0) flags &= ~(FF_RENDERALL | FF_BOTHPLANES | FF_ALLSIDES);
			else if (alpha != 255) flags |= FF_TRANSLUCENT;

		}
		P_Add3DFloor(ss, sec, line, flags, alpha);
	}
	// To be 100% safe this should be done even if the alpha by texture value isn't used.
	if (!line->sidedef[0]->GetTexture(side_t::top).isValid())
		line->sidedef[0]->SetTexture(side_t::top, FNullTextureID());
	return 1;
}